

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

CallReaction testing::Mock::GetReactionOnUninterestingCalls(void *mock_obj)

{
  long lVar1;
  mapped_type *pmVar2;
  long lVar3;
  CallReaction CVar4;
  key_type in_RDI;
  bool bVar5;
  key_type local_10;
  
  local_10 = in_RDI;
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  lVar1 = 0x193c90;
  if ((anonymous_namespace)::g_uninteresting_call_reaction._16_8_ != 0) {
    lVar1 = 0x193c90;
    lVar3 = (anonymous_namespace)::g_uninteresting_call_reaction._16_8_;
    do {
      bVar5 = *(key_type *)(lVar3 + 0x20) < local_10;
      if (!bVar5) {
        lVar1 = lVar3;
      }
      lVar3 = *(long *)(lVar3 + 0x10 + (ulong)bVar5 * 8);
    } while (lVar3 != 0);
  }
  if ((lVar1 == 0x193c90) || (local_10 < *(key_type *)(lVar1 + 0x20))) {
    CVar4 = kWarn;
    if (FLAGS_gmock_default_mock_behavior < (kFail|kWarn)) {
      CVar4 = FLAGS_gmock_default_mock_behavior;
    }
  }
  else {
    pmVar2 = std::
             map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
             ::operator[]((map<const_void_*,_testing::internal::CallReaction,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::internal::CallReaction>_>_>
                           *)(anonymous_namespace)::g_uninteresting_call_reaction,&local_10);
    CVar4 = *pmVar2;
  }
  internal::MutexBase::Unlock((MutexBase *)internal::g_gmock_mutex);
  return CVar4;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  return (g_uninteresting_call_reaction.count(mock_obj) == 0) ?
      internal::intToCallReaction(GMOCK_FLAG(default_mock_behavior)) :
      g_uninteresting_call_reaction[mock_obj];
}